

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int32 intConst,Instr *instr,Opnd *opnd)

{
  IntConstantToValueMap *pIVar1;
  Type piVar2;
  Sym *sym;
  bool bVar3;
  uint uVar4;
  Value *val;
  Value *pVVar5;
  Type pSVar6;
  uint uVar7;
  int local_34 [2];
  int32 symStoreIntConstantValue;
  
  pIVar1 = this->intConstantToValueMap;
  piVar2 = pIVar1->buckets;
  uVar4 = 0;
  if (piVar2 != (Type)0x0) {
    uVar4 = JsUtil::
            BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(intConst * 2 + 1,pIVar1->bucketCount,pIVar1->modFunctionIndex);
    uVar7 = piVar2[uVar4];
    uVar4 = 0;
    if (-1 < (int)uVar7) {
      pSVar6 = pIVar1->entries;
      uVar4 = 0;
      do {
        if (pSVar6[uVar7].
            super_DefaultHashedEntry<int,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
            super_KeyValueEntry<int,_Value_*>.
            super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Value_*>_>
            .super_KeyValueEntryDataLayout2<int,_Value_*>.key == intConst) {
          if (pIVar1->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pIVar1->stats,uVar4);
            pSVar6 = pIVar1->entries;
          }
          pVVar5 = pSVar6[uVar7].
                   super_DefaultHashedEntry<int,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<int,_Value_*>.
                   super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Value_*>_>
                   .super_KeyValueEntryDataLayout2<int,_Value_*>.value;
          if ((((pVVar5 == (Value *)0x0) || (sym = pVVar5->valueInfo->symStore, sym == (Sym *)0x0))
              || (bVar3 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym), !bVar3))
             || (((val = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym),
                  val == (Value *)0x0 || (val->valueNumber != pVVar5->valueNumber)) ||
                 ((bVar3 = ValueInfo::TryGetIntConstantValue(val->valueInfo,local_34,false), !bVar3
                  || (local_34[0] != intConst)))))) goto LAB_0044f8bf;
          goto LAB_0044f8d6;
        }
        uVar4 = uVar4 + 1;
        uVar7 = pSVar6[uVar7].
                super_DefaultHashedEntry<int,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<int,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Value_*>_>
                .super_KeyValueEntryDataLayout2<int,_Value_*>.next;
      } while (-1 < (int)uVar7);
    }
  }
  if (pIVar1->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pIVar1->stats,uVar4);
  }
LAB_0044f8bf:
  val = NewIntConstantValue(this,intConst,instr,true);
LAB_0044f8d6:
  pVVar5 = GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,val,opnd);
  return pVVar5;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int32 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Value *value = nullptr;
    Value *const cachedValue = this->intConstantToValueMap->Lookup(intConst, nullptr);

    if(cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && CurrentBlockData()->IsLive(symStore))
        {

            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            int32 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetIntConstantValue(&symStoreIntConstantValue) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewIntConstantValue(intConst, instr, !Js::TaggedInt::IsOverflow(intConst));
    }

    return CurrentBlockData()->InsertNewValue(value, opnd);
}